

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O0

char * Curl_formpostheader(void *formp,size_t *len)

{
  Form *form;
  char *header;
  size_t *len_local;
  void *formp_local;
  
  if (*formp == 0) {
    formp_local = (void *)0x0;
  }
  else {
    formp_local = *(void **)(*formp + 0x10);
    *len = *(size_t *)(*formp + 0x18);
    *(undefined8 *)formp = **formp;
  }
  return (char *)formp_local;
}

Assistant:

char *Curl_formpostheader(void *formp, size_t *len)
{
  char *header;
  struct Form *form=(struct Form *)formp;

  if(!form->data)
    return 0; /* nothing, ERROR! */

  header = form->data->line;
  *len = form->data->length;

  form->data = form->data->next; /* advance */

  return header;
}